

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  TTD_LOG_PTR_ID val;
  int64 val_00;
  
  if (evt->EventKind == TTDInnerLoopLogWriteTag) {
    val._0_4_ = evt[1].EventKind;
    val._4_4_ = evt[1].ResultStatus;
    FileWriter::WriteLogTag(writer,sourceContextId,val,CommaSeparator);
    FileWriter::WriteInt64(writer,eventTime,evt[1].EventTimeStamp,CommaSeparator);
    val_00._0_4_ = evt[2].EventKind;
    val_00._4_4_ = evt[2].ResultStatus;
    FileWriter::WriteInt64(writer,functionTime,val_00,CommaSeparator);
    FileWriter::WriteInt64(writer,loopTime,evt[2].EventTimeStamp,CommaSeparator);
    FileWriter::WriteUInt32(writer,functionBodyId,evt[3].EventKind,CommaSeparator);
    FileWriter::WriteUInt32(writer,functionColumn,evt[3].ResultStatus,CommaSeparator);
    FileWriter::WriteUInt32(writer,functionLine,(uint32)evt[3].EventTimeStamp,CommaSeparator);
    FileWriter::WriteUInt32
              (writer,line,*(uint32 *)((long)&evt[3].EventTimeStamp + 4),CommaSeparator);
    FileWriter::WriteUInt32(writer,column,evt[4].EventKind,CommaSeparator);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void TTDInnerLoopLogWriteEventLogEntry_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const TTDInnerLoopLogWriteEventLogEntry* ilevt = GetInlineEventDataAs<TTDInnerLoopLogWriteEventLogEntry, EventKind::TTDInnerLoopLogWriteTag>(evt);

            writer->WriteLogTag(NSTokens::Key::sourceContextId, ilevt->SourceScriptLogId, NSTokens::Separator::CommaSeparator);
            writer->WriteInt64(NSTokens::Key::eventTime, ilevt->EventTime, NSTokens::Separator::CommaSeparator);
            writer->WriteInt64(NSTokens::Key::functionTime, ilevt->FunctionTime, NSTokens::Separator::CommaSeparator);
            writer->WriteInt64(NSTokens::Key::loopTime, ilevt->LoopTime, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::functionBodyId, ilevt->TopLevelBodyId, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::functionColumn, ilevt->FunctionLine, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::functionLine, ilevt->FunctionColumn, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::line, ilevt->Line, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::column, ilevt->Column, NSTokens::Separator::CommaSeparator);
        }